

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O2

int __thiscall
CVmObjStringBuffer::getp_copyChars
          (CVmObjStringBuffer *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  ushort uVar1;
  vm_val_t *pvVar2;
  int iVar3;
  ushort *puVar4;
  size_t sVar5;
  int iVar6;
  vm_val_t srcval;
  
  if (getp_copyChars(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar3 = __cxa_guard_acquire(&getp_copyChars(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar3 != 0) {
      getp_copyChars::desc.min_argc_ = 2;
      getp_copyChars::desc.opt_argc_ = 0;
      getp_copyChars::desc.varargs_ = 0;
      __cxa_guard_release(&getp_copyChars(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,argc,&getp_copyChars::desc);
  if (iVar3 == 0) {
    iVar3 = CVmBif::pop_int_val();
    if (iVar3 < 0) {
      iVar6 = *(int *)(this->super_CVmObject).ext_;
    }
    else {
      iVar6 = -1;
    }
    puVar4 = (ushort *)vm_val_t::cast_to_string(sp_ + -1,&srcval);
    pvVar2 = sp_;
    pvVar2[-1].typ = srcval.typ;
    *(undefined4 *)&pvVar2[-1].field_0x4 = srcval._4_4_;
    pvVar2[-1].val = srcval.val;
    uVar1 = *puVar4;
    sVar5 = utf8_ptr::s_len((char *)(puVar4 + 1),(ulong)uVar1);
    splice_text(this,self,iVar6 + iVar3,(int32_t)sVar5,(char *)(puVar4 + 1),(uint)uVar1,1);
    sp_ = sp_ + -1;
    retval->typ = VM_OBJ;
    (retval->val).obj = self;
  }
  return 1;
}

Assistant:

int CVmObjStringBuffer::getp_copyChars(VMG_ vm_obj_id_t self,
                                       vm_val_t *retval, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(2);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* pop the insertion index; adjust to 0-based or end-based indexing */
    int32_t idx = CVmBif::pop_int_val(vmg0_);
    idx += (idx < 0 ? get_ext()->len : -1);

    /* get or cast the string; leave it on the stack for gc protection */
    vm_val_t srcval;
    const char *src = G_stk->get(0)->cast_to_string(vmg_ &srcval);
    *G_stk->get(0) = srcval;

    /* 
     *   Get the character length of the new text.  This is the number of
     *   characters we're overwriting (effectively deleting) in the current
     *   buffer.  
     */
    size_t src_bytes = vmb_get_len(src);
    src += VMB_LEN;
    
    /* get the new text's character length */
    utf8_ptr srcp((char *)src);
    size_t src_chars = srcp.len(src_bytes);

    /* splice the text */
    splice_text(vmg_ self, idx, src_chars, src, src_bytes, TRUE);

    /* discard gc protection */
    G_stk->discard();

    /* handled */
    retval->set_obj(self);
    return TRUE;
}